

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_hilbert.cpp
# Opt level: O0

Read<long> __thiscall Omega_h::hilbert::dists_from_coords_dim<2>(hilbert *this,Reals *coords)

{
  double dVar1;
  int size_in;
  void *extraout_RDX;
  Read<long> RVar2;
  double local_6c8;
  Write<long> local_6a0;
  undefined1 local_690 [8];
  type_conflict f;
  string local_638 [32];
  undefined1 local_618 [8];
  Write<long> out;
  int npts;
  Affine<2> unit_affine;
  Read<double> local_560;
  undefined1 local_550 [8];
  BBox<2> bbox;
  Reals *coords_local;
  ulong local_508;
  double local_500 [4];
  int local_4dc;
  double dStack_4d8;
  Int i_2;
  double local_4d0;
  double local_4c8;
  double local_4c0;
  double local_4b8;
  double local_4b0;
  double local_4a8;
  double local_4a0;
  double local_498;
  double maxl;
  double local_488;
  double local_480 [4];
  void *local_460;
  double local_458;
  double local_450;
  double local_448;
  double local_440;
  double local_438;
  double local_430;
  double local_428;
  undefined8 local_420;
  double local_418;
  void *local_410;
  Tensor<2> a_1;
  undefined8 uStack_3e8;
  Int i_3;
  Vector<2> s;
  double dStack_3d0;
  Int i_1;
  double out_1;
  double local_3c0 [2];
  double *local_3b0;
  undefined1 *local_3a8;
  long local_3a0;
  int local_394;
  double dStack_390;
  Int i;
  double local_388;
  double local_380 [3];
  Vector<2> c;
  int local_2bc;
  int local_2b8;
  Int i_5;
  Int j;
  Int i_4;
  double local_2a8;
  int local_29c;
  double *local_298;
  int local_28c;
  Int *local_288;
  int local_27c;
  double *local_278;
  Int local_26c;
  double *local_268;
  undefined8 uStack_260;
  double dStack_258;
  Int i_9;
  double local_250 [2];
  Vector<2> c_5;
  void *local_218;
  double local_210 [3];
  void *local_1f8;
  double local_1f0;
  double local_1d8;
  double local_1d0;
  int local_1b4;
  Int j_1;
  double local_1a0 [3];
  Vector<2> c_1;
  int local_10c;
  Int i_7;
  void *local_100;
  double local_f8 [2];
  Vector<2> c_3;
  int local_bc;
  Int i_6;
  double local_b0 [3];
  Vector<2> c_2;
  int local_6c;
  Int i_8;
  double local_58 [3];
  Vector<2> c_4;
  
  bbox.max.super_Few<double,_2>.array_[1] = (double)coords;
  Read<double>::Read(&local_560,coords);
  find_bounding_box<2>((BBox<2> *)local_550,&local_560);
  Read<double>::~Read(&local_560);
  local_500[0] = (double)local_550;
  local_500[1] = bbox.min.super_Few<double,_2>.array_[0];
  local_500[2] = bbox.min.super_Few<double,_2>.array_[1];
  local_500[3] = bbox.max.super_Few<double,_2>.array_[0];
  local_4c8 = bbox.min.super_Few<double,_2>.array_[1];
  local_4c0 = bbox.max.super_Few<double,_2>.array_[0];
  dStack_4d8 = (double)local_550;
  local_4d0 = bbox.min.super_Few<double,_2>.array_[0];
  local_380[0] = bbox.min.super_Few<double,_2>.array_[1];
  local_380[1] = bbox.max.super_Few<double,_2>.array_[0];
  dStack_390 = (double)local_550;
  local_388 = bbox.min.super_Few<double,_2>.array_[0];
  for (local_394 = 0; local_394 < 2; local_394 = local_394 + 1) {
    c.super_Few<double,_2>.array_[1]._4_4_ = local_394;
    (&c)[-1].super_Few<double,_2>.array_[(long)local_394 + 1] =
         local_380[local_394] - *(double *)((long)&stack0xfffffffffffffc70 + (long)local_394 * 8);
  }
  local_4b8 = local_380[2];
  local_4b0 = c.super_Few<double,_2>.array_[0];
  local_4a8 = local_380[2];
  local_4a0 = c.super_Few<double,_2>.array_[0];
  local_3c0[0] = local_380[2];
  local_3c0[1] = c.super_Few<double,_2>.array_[0];
  dStack_3d0 = local_380[2];
  for (s.super_Few<double,_2>.array_[1]._4_4_ = 1; s.super_Few<double,_2>.array_[1]._4_4_ < 2;
      s.super_Few<double,_2>.array_[1]._4_4_ = s.super_Few<double,_2>.array_[1]._4_4_ + 1) {
    local_3b0 = local_3c0 + s.super_Few<double,_2>.array_[1]._4_4_;
    local_3a0 = (long)&out_1 + 7;
    local_3a8 = (undefined1 *)&stack0xfffffffffffffc30;
    if (*local_3b0 <= dStack_3d0) {
      local_6c8 = dStack_3d0;
    }
    else {
      local_6c8 = *local_3b0;
    }
    dStack_3d0 = local_6c8;
  }
  local_498 = dStack_3d0;
  for (local_4dc = 0; local_4dc < 2; local_4dc = local_4dc + 1) {
    local_500[(long)local_4dc + 2] = local_500[local_4dc] + dStack_3d0;
  }
  maxl = (double)local_550;
  local_488 = bbox.min.super_Few<double,_2>.array_[0];
  local_480[0] = bbox.min.super_Few<double,_2>.array_[1];
  local_480[1] = bbox.max.super_Few<double,_2>.array_[0];
  for (a_1.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1]._4_4_ = 0;
      a_1.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1]._4_4_ < 2;
      a_1.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1]._4_4_ =
           a_1.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1]._4_4_ + 1)
  {
    *(double *)
     ((long)&stack0xfffffffffffffc18 +
     (long)a_1.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1]._4_4_ * 8)
         = 1.0 / (local_480[a_1.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.
                            array_[1]._4_4_] -
                 (&maxl)[a_1.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_
                         [1]._4_4_]);
  }
  local_420 = uStack_3e8;
  local_418 = s.super_Few<double,_2>.array_[0];
  _j = uStack_3e8;
  local_2a8 = s.super_Few<double,_2>.array_[0];
  for (i_5 = 0; local_2b8 = i_5, i_5 < 2; i_5 = i_5 + 1) {
    while (local_2b8 = local_2b8 + 1, local_2b8 < 2) {
      local_268 = a_1.super_Few<Omega_h::Vector<2>,_2>.array_[(long)local_2b8 + -1].
                  super_Few<double,_2>.array_ + 1;
      local_26c = i_5;
      local_268[i_5] = 0.0;
      local_278 = a_1.super_Few<Omega_h::Vector<2>,_2>.array_[(long)i_5 + -1].super_Few<double,_2>.
                  array_ + 1;
      local_27c = local_2b8;
      local_278[local_2b8] = 0.0;
    }
  }
  for (local_2bc = 0; local_2bc < 2; local_2bc = local_2bc + 1) {
    local_28c = local_2bc;
    local_288 = &j;
    local_298 = a_1.super_Few<Omega_h::Vector<2>,_2>.array_[(long)local_2bc + -1].
                super_Few<double,_2>.array_ + 1;
    local_29c = local_2bc;
    local_298[local_2bc] = *(double *)(local_288 + (long)local_2bc * 2);
  }
  local_460 = local_410;
  local_458 = a_1.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
  local_450 = a_1.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
  local_448 = a_1.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
  local_480[2] = (double)local_550;
  local_480[3] = bbox.min.super_Few<double,_2>.array_[0];
  local_218 = local_410;
  local_210[0] = a_1.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
  local_210[1] = a_1.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
  local_210[2] = a_1.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
  local_1a0[0] = (double)local_550;
  local_1a0[1] = bbox.min.super_Few<double,_2>.array_[0];
  for (local_bc = 0; local_bc < 2; local_bc = local_bc + 1) {
    c_2.super_Few<double,_2>.array_[1]._4_4_ = local_bc;
    (&c_2)[-1].super_Few<double,_2>.array_[(long)local_bc + 1] =
         local_b0[local_bc] * (double)local_550;
  }
  local_1a0[2] = local_b0[2];
  c_1.super_Few<double,_2>.array_[0] = c_2.super_Few<double,_2>.array_[0];
  for (local_1b4 = 1; local_1b4 < 2; local_1b4 = local_1b4 + 1) {
    local_1d8 = local_1a0[2];
    local_1d0 = c_1.super_Few<double,_2>.array_[0];
    local_1f8 = (&local_218)[(long)local_1b4 * 2];
    local_1f0 = local_210[(long)local_1b4 * 2];
    c_1.super_Few<double,_2>.array_[1]._4_4_ = local_1b4;
    dVar1 = local_1a0[local_1b4];
    for (local_10c = 0; local_10c < 2; local_10c = local_10c + 1) {
      c_3.super_Few<double,_2>.array_[1]._4_4_ = local_10c;
      (&c_3)[-1].super_Few<double,_2>.array_[(long)local_10c + 1] =
           (double)(&local_100)[local_10c] * dVar1;
    }
    local_58[0] = local_1a0[2];
    local_58[1] = c_1.super_Few<double,_2>.array_[0];
    for (local_6c = 0; local_6c < 2; local_6c = local_6c + 1) {
      c_4.super_Few<double,_2>.array_[1]._4_4_ = local_6c;
      (&c_4)[-1].super_Few<double,_2>.array_[(long)local_6c + 1] =
           local_58[local_6c] + *(double *)(&stack0xffffffffffffff98 + (long)local_6c * 8);
    }
    local_1a0[2] = local_58[2];
    c_1.super_Few<double,_2>.array_[0] = c_4.super_Few<double,_2>.array_[0];
    local_100 = local_1f8;
    local_f8[0] = local_1f0;
  }
  local_440 = local_1a0[2];
  local_438 = c_1.super_Few<double,_2>.array_[0];
  dStack_258 = local_1a0[2];
  local_250[0] = c_1.super_Few<double,_2>.array_[0];
  for (uStack_260._4_4_ = 0; uStack_260._4_4_ < 2; uStack_260._4_4_ = uStack_260._4_4_ + 1) {
    c_5.super_Few<double,_2>.array_[1]._4_4_ = uStack_260._4_4_;
    (&c_5)[-1].super_Few<double,_2>.array_[(long)uStack_260._4_4_ + 1] =
         -(&c_5)[-2].super_Few<double,_2>.array_[(long)uStack_260._4_4_ + 1];
  }
  local_430 = local_250[1];
  local_428 = c_5.super_Few<double,_2>.array_[0];
  if (((ulong)(coords->write_).shared_alloc_.alloc & 1) == 0) {
    local_508 = ((coords->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_508 = (ulong)(coords->write_).shared_alloc_.alloc >> 3;
  }
  out.shared_alloc_.direct_ptr._4_4_ = divide_no_remainder<int>((int)(local_508 >> 3),2);
  size_in = out.shared_alloc_.direct_ptr._4_4_ * 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_638,"",(allocator *)((long)&f.out.shared_alloc_.direct_ptr + 7));
  Write<long>::Write((Write<long> *)local_618,size_in,(string *)local_638);
  std::__cxx11::string::~string(local_638);
  std::allocator<char>::~allocator((allocator<char> *)((long)&f.out.shared_alloc_.direct_ptr + 7));
  Read<double>::Read((Read<double> *)local_690,coords);
  f.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[1] =
       local_250[1];
  f.unit_affine.t.super_Few<double,_2>.array_[0] = c_5.super_Few<double,_2>.array_[0];
  f.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1] =
       a_1.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1];
  f.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0] =
       a_1.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_[0];
  f.coords.write_.shared_alloc_.direct_ptr = local_410;
  f.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0] =
       a_1.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0];
  Write<long>::Write((Write<long> *)(f.unit_affine.t.super_Few<double,_2>.array_ + 1),
                     (Write<int> *)local_618);
  parallel_for<Omega_h::hilbert::dists_from_coords_dim<2>(Omega_h::Read<double>)::_lambda(int)_1_>
            (out.shared_alloc_.direct_ptr._4_4_,(type_conflict *)local_690,
             "hilbert::dists_from_coords");
  Write<long>::Write(&local_6a0,(Write<int> *)local_618);
  Read<long>::Read((Read<long> *)this,&local_6a0);
  Write<long>::~Write(&local_6a0);
  dists_from_coords_dim<2>(Omega_h::Read<double>)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)local_690);
  Write<long>::~Write((Write<long> *)local_618);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<long>)RVar2.write_.shared_alloc_;
}

Assistant:

Read<I64> dists_from_coords_dim(Reals coords) {
  auto bbox = find_bounding_box<dim>(coords);
  bbox = make_equilateral(bbox);
  auto unit_affine = get_affine_from_bbox_into_unit(bbox);
  auto npts = divide_no_remainder(coords.size(), dim);
  Write<I64> out(npts * dim);
  auto f = OMEGA_H_LAMBDA(LO i) {
    constexpr Int nbits = MANTISSA_BITS;
    auto spatial_coord = get_vector<dim>(coords, i);
    auto hilbert_coord =
        hilbert::from_spatial(unit_affine, nbits, spatial_coord);
    for (Int j = 0; j < dim; ++j) {
      auto sv = static_cast<I64>(hilbert_coord[j]);
      OMEGA_H_CHECK(sv >= 0);
      out[i * dim + j] = sv;
    }
  };
  parallel_for(npts, f, "hilbert::dists_from_coords");
  return out;
}